

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O1

void BrotliInitDistanceParams(BrotliEncoderParams *params,uint32_t npostfix,uint32_t ndirect)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  
  uVar6 = (ulong)ndirect;
  bVar3 = (byte)npostfix;
  (params->dist).distance_postfix_bits = npostfix;
  (params->dist).num_direct_distance_codes = ndirect;
  if (params->large_window == 0) {
    uVar9 = ndirect + (0x18 << (bVar3 + 1 & 0x1f)) + 0x10;
    uVar6 = (ulong)uVar9;
    sVar8 = (size_t)((1 << (bVar3 + 0x1a & 0x1f)) + ndirect + (-1 << (bVar3 + 2 & 0x1f)));
  }
  else {
    if (ndirect < 0x7ffffffc) {
      uVar5 = 0xffffffff;
      uVar10 = -1 << (bVar3 & 0x1f);
      uVar7 = (0x7ffffffc - ndirect >> (bVar3 & 0x1f)) + 4;
      iVar4 = -5;
      uVar9 = uVar7;
      do {
        uVar5 = uVar5 + 1;
        iVar4 = iVar4 + 2;
        bVar1 = 3 < uVar9;
        uVar9 = uVar9 >> 1;
      } while (bVar1);
      uVar5 = (uint)((uVar7 >> (uVar5 & 0x1f) & 1) != 0) + iVar4;
      uVar9 = ndirect + 0x10;
      if (uVar5 != 0xffffffff) {
        bVar2 = (byte)(uVar5 >> 1);
        uVar6 = (ulong)((ndirect - uVar10) +
                       ((6 << (bVar2 & 0x1f)) + ((uVar5 & 1) << (bVar2 + 1 & 0x1f)) + -5 <<
                       (bVar3 & 0x1f)));
        uVar9 = ndirect + (uVar5 << (bVar3 & 0x1f) | ~uVar10) + 0x11;
      }
      uVar6 = (ulong)uVar9 | uVar6 << 0x20;
    }
    else {
      uVar6 = 0x7ffffffc8000000c;
    }
    sVar8 = uVar6 >> 0x20;
    uVar9 = ndirect + 0x10 + (0x3e << (bVar3 + 1 & 0x1f));
  }
  (params->dist).alphabet_size_max = uVar9;
  (params->dist).alphabet_size_limit = (uint32_t)uVar6;
  (params->dist).max_distance = sVar8;
  return;
}

Assistant:

void BrotliInitDistanceParams(BrotliEncoderParams* params,
    uint32_t npostfix, uint32_t ndirect) {
  BrotliDistanceParams* dist_params = &params->dist;
  uint32_t alphabet_size_max;
  uint32_t alphabet_size_limit;
  uint32_t max_distance;

  dist_params->distance_postfix_bits = npostfix;
  dist_params->num_direct_distance_codes = ndirect;

  alphabet_size_max = BROTLI_DISTANCE_ALPHABET_SIZE(
      npostfix, ndirect, BROTLI_MAX_DISTANCE_BITS);
  alphabet_size_limit = alphabet_size_max;
  max_distance = ndirect + (1U << (BROTLI_MAX_DISTANCE_BITS + npostfix + 2)) -
      (1U << (npostfix + 2));

  if (params->large_window) {
    BrotliDistanceCodeLimit limit = BrotliCalculateDistanceCodeLimit(
        BROTLI_MAX_ALLOWED_DISTANCE, npostfix, ndirect);
    alphabet_size_max = BROTLI_DISTANCE_ALPHABET_SIZE(
        npostfix, ndirect, BROTLI_LARGE_MAX_DISTANCE_BITS);
    alphabet_size_limit = limit.max_alphabet_size;
    max_distance = limit.max_distance;
  }

  dist_params->alphabet_size_max = alphabet_size_max;
  dist_params->alphabet_size_limit = alphabet_size_limit;
  dist_params->max_distance = max_distance;
}